

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O2

Roaring * doublechecked::Roaring::fastunion
                    (Roaring *__return_storage_ptr__,size_t n,Roaring **inputs)

{
  bool bVar1;
  Roaring **inputs_00;
  uint64_t uVar2;
  size_t i;
  size_t sVar3;
  Roaring temp;
  
  inputs_00 = (Roaring **)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    inputs_00[sVar3] = &inputs[sVar3]->plain;
  }
  roaring::Roaring::fastunion(&temp.plain,n,inputs_00);
  Roaring(__return_storage_ptr__,&temp.plain);
  roaring::Roaring::~Roaring(&temp.plain);
  operator_delete__(inputs_00);
  if (n == 0) {
    uVar2 = cardinality(__return_storage_ptr__);
    _assert_true((ulong)(uVar2 == 0),"ans.cardinality() == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
                 ,0x297);
  }
  else {
    Roaring(&temp,*inputs);
    for (sVar3 = 1; n != sVar3; sVar3 = sVar3 + 1) {
      operator|=(&temp,inputs[sVar3]);
    }
    bVar1 = operator==(&temp,__return_storage_ptr__);
    _assert_true((ulong)bVar1,"temp == ans",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
                 ,0x29b);
    ~Roaring(&temp);
  }
  return __return_storage_ptr__;
}

Assistant:

static Roaring fastunion(size_t n, const Roaring **inputs) {
        auto plain_inputs = new const roaring::Roaring *[n];
        for (size_t i = 0; i < n; ++i) plain_inputs[i] = &inputs[i]->plain;
        Roaring ans(roaring::Roaring::fastunion(n, plain_inputs));
        delete[] plain_inputs;

        if (n == 0)
            assert_true(ans.cardinality() == 0);
        else {
            Roaring temp = *inputs[0];
            for (size_t i = 1; i < n; ++i) temp |= *inputs[i];
            assert_true(temp == ans);
        }

        return ans;
    }